

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Mac::SublimeMergeReporter::SublimeMergeReporter(SublimeMergeReporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Mac::SUBLIME_MERGE();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001bd1f0;
  SystemLauncher::setForeground(&(this->super_GenericDiffReporter).launcher,true);
  return;
}

Assistant:

SublimeMergeReporter::SublimeMergeReporter()
            : GenericDiffReporter(DiffPrograms::Mac::SUBLIME_MERGE())
        {
            launcher.setForeground(true);
        }